

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::CompLayer::CompLayer
          (CompLayer *this,Layer *layerModel,VArenaAlloc *allocator)

{
  bool bVar1;
  reference ppOVar2;
  reference ppLVar3;
  size_type sVar4;
  Layer *in_RSI;
  Layer *in_RDI;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  search;
  int id;
  Layer **layer;
  iterator __end1;
  iterator __begin1;
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  *__range1;
  Layer *item;
  Layer *model;
  const_reverse_iterator it;
  Layer *in_stack_ffffffffffffff48;
  VArenaAlloc *in_stack_ffffffffffffff50;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  in_stack_ffffffffffffff68;
  VSize local_90;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  local_68;
  int local_5c;
  reference local_58;
  Layer **local_50;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  local_48;
  unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
  *local_40;
  Layer *local_38;
  Object *local_30;
  Layer *local_10;
  
  local_10 = in_RSI;
  Layer::Layer((Layer *)in_stack_ffffffffffffff60._M_current,in_RDI);
  (in_RDI->super_Group).super_Object.field_0.mPtr = (char *)&PTR__CompLayer_001b56b0;
  std::
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ::vector((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            *)0x15fc35);
  std::
  unique_ptr<rlottie::internal::renderer::Clipper,std::default_delete<rlottie::internal::renderer::Clipper>>
  ::unique_ptr<std::default_delete<rlottie::internal::renderer::Clipper>,void>
            ((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
              *)in_stack_ffffffffffffff50);
  bVar1 = std::
          vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
          ::empty((vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                   *)in_stack_ffffffffffffff60._M_current);
  if (!bVar1) {
    in_stack_ffffffffffffff50 = (VArenaAlloc *)&in_RDI->mExtra;
    std::
    vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
    ::size((vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            *)((in_RDI->super_Group).mChildren.
               super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
               ._M_impl.super__Vector_impl_data._M_start + 2));
    std::
    vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
    ::reserve((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
               *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              in_stack_ffffffffffffff78);
  }
  std::
  vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>::
  crbegin((vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
           *)in_RDI);
  while( true ) {
    std::
    vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
    ::rend((vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            *)in_RDI);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                             *)in_stack_ffffffffffffff60._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_**,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                             *)in_RDI);
    if (!bVar1) break;
    ppOVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                           *)in_stack_ffffffffffffff50);
    local_30 = *ppOVar2;
    local_38 = createLayerItem(in_RDI,in_stack_ffffffffffffff50);
    if (local_38 != (Layer *)0x0) {
      std::
      vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
      ::push_back((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                   *)in_stack_ffffffffffffff60._M_current,(value_type *)in_RDI);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                  *)in_stack_ffffffffffffff50);
  }
  local_40 = &in_RDI->mExtra;
  local_48._M_current =
       (Layer **)
       std::
       vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
       ::begin((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                *)in_stack_ffffffffffffff48);
  local_50 = (Layer **)
             std::
             vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
             ::end((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                    *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
               ::operator*(&local_48);
    local_5c = Layer::parentId((Layer *)0x15fd9d);
    if (-1 < local_5c) {
      std::
      vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
      ::begin((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
               *)in_stack_ffffffffffffff48);
      std::
      vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
      ::end((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
             *)in_stack_ffffffffffffff48);
      local_68 = std::
                 find_if<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Layer**,std::vector<rlottie::internal::renderer::Layer*,std::allocator<rlottie::internal::renderer::Layer*>>>,rlottie::internal::renderer::CompLayer::CompLayer(rlottie::internal::model::Layer*,VArenaAlloc*)::__0>
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            (anon_class_4_1_3fcf65d9_for__M_pred)(int)((ulong)in_RDI >> 0x20));
      std::
      vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
      ::end((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
             *)in_stack_ffffffffffffff48);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                          *)in_stack_ffffffffffffff48);
      if (bVar1) {
        in_stack_ffffffffffffff48 = *local_58;
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                  ::operator*(&local_68);
        Layer::setParentLayer(in_stack_ffffffffffffff48,*ppLVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
    ::operator++(&local_48);
  }
  local_90 = internal::model::Layer::layerSize(local_10);
  bVar1 = VSize::empty(&local_90);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    internal::model::Layer::layerSize(local_10);
    std::make_unique<rlottie::internal::renderer::Clipper,VSize>
              ((VSize *)in_stack_ffffffffffffff68._M_current);
    std::
    unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
    ::operator=((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                 *)in_stack_ffffffffffffff50,
                (unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                 *)in_stack_ffffffffffffff48);
    std::
    unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
    ::~unique_ptr((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                   *)in_stack_ffffffffffffff50);
  }
  sVar4 = std::
          vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
          ::size((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                  *)&in_RDI->mExtra);
  if (1 < sVar4) {
    Layer::setComplexContent((Layer *)in_RDI,true);
  }
  return;
}

Assistant:

renderer::CompLayer::CompLayer(model::Layer *layerModel, VArenaAlloc *allocator)
    : renderer::Layer(layerModel)
{
    if (!mLayerData->mChildren.empty())
        mLayers.reserve(mLayerData->mChildren.size());

    // 1. keep the layer in back-to-front order.
    // as lottie model keeps the data in front-toback-order.
    for (auto it = mLayerData->mChildren.crbegin();
         it != mLayerData->mChildren.rend(); ++it) {
        auto model = static_cast<model::Layer *>(*it);
        auto item = createLayerItem(model, allocator);
        if (item) mLayers.push_back(item);
    }

    // 2. update parent layer
    for (const auto &layer : mLayers) {
        int id = layer->parentId();
        if (id >= 0) {
            auto search =
                std::find_if(mLayers.begin(), mLayers.end(),
                             [id](const auto &val) { return val->id() == id; });
            if (search != mLayers.end()) layer->setParentLayer(*search);
        }
    }

    // 4. check if its a nested composition
    if (!layerModel->layerSize().empty()) {
        mClipper = std::make_unique<renderer::Clipper>(layerModel->layerSize());
    }

    if (mLayers.size() > 1) setComplexContent(true);
}